

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.h
# Opt level: O0

void __thiscall TreeNode::addElement(TreeNode *this,QString *filepath,VCFilterFile *allInfo)

{
  int iVar1;
  TreeNode *pTVar2;
  undefined8 in_RDX;
  longlong in_RSI;
  QMap<QString,_TreeNode_*> *in_RDI;
  long in_FS_OFFSET;
  int index;
  TreeNode *n;
  QString newNodeName;
  VCFilterFile *in_stack_ffffffffffffff58;
  TreeNode *in_stack_ffffffffffffff60;
  QString *in_stack_ffffffffffffff68;
  QString *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined1 local_60 [24];
  undefined8 local_48;
  TreeNode *local_40;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QString::QString((QString *)in_stack_ffffffffffffff60,(QString *)in_stack_ffffffffffffff58);
  iVar1 = pathIndex((TreeNode *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                    in_stack_ffffffffffffff78);
  if (iVar1 != -1) {
    QString::left(in_stack_ffffffffffffff78,(qsizetype)in_RDI);
    QString::operator=((QString *)in_stack_ffffffffffffff60,(QString *)in_stack_ffffffffffffff58);
    QString::~QString((QString *)0x27de8e);
  }
  local_48 = 0;
  local_40 = QMap<QString,_TreeNode_*>::value
                       (in_RDI,in_stack_ffffffffffffff68,(TreeNode **)in_stack_ffffffffffffff60);
  if (local_40 == (TreeNode *)0x0) {
    pTVar2 = (TreeNode *)operator_new(0x30);
    TreeNode(in_stack_ffffffffffffff60);
    local_40 = pTVar2;
    VCFilterFile::operator=((VCFilterFile *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    QMap<QString,_TreeNode_*>::insert
              (in_RDI,(QString *)pTVar2,(TreeNode **)in_stack_ffffffffffffff60);
  }
  if (iVar1 != -1) {
    pTVar2 = local_40;
    QString::mid((longlong)local_60,in_RSI);
    (*(pTVar2->super_Node)._vptr_Node[2])(pTVar2,local_60,in_RDX);
    QString::~QString((QString *)0x27df63);
  }
  QString::~QString((QString *)0x27df70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void addElement(const QString &filepath, const VCFilterFile &allInfo) override {
        QString newNodeName(filepath);

        int index = pathIndex(filepath);
        if (index != -1)
            newNodeName = filepath.left(index);

        TreeNode *n = children.value(newNodeName);
        if (!n) {
            n = new TreeNode;
            n->info = allInfo;
            children.insert(newNodeName, n);
        }
        if (index != -1)
            n->addElement(filepath.mid(index+1), allInfo);
    }